

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-make.c
# Opt level: O0

_Bool place_friends(chunk *c,loc_conflict grid,monster_race *race,monster_race *friends_race,
                   wchar_t total,_Bool sleep,monster_group_info group_info,uint8_t origin)

{
  _Bool _Var1;
  int iVar2;
  uint32_t uVar3;
  wchar_t wVar4;
  _Bool local_4d;
  loc_conflict lStack_4c;
  _Bool success;
  loc_conflict new;
  _Bool is_unique;
  wchar_t level_difference;
  wchar_t extra_chance;
  _Bool sleep_local;
  wchar_t total_local;
  monster_race *friends_race_local;
  monster_race *race_local;
  chunk *c_local;
  loc_conflict grid_local;
  
  new.y = (c->depth - friends_race->level) + L'\x05';
  new.x._3_1_ = flag_has_dbg(friends_race->flags,0xc,1,"friends_race->flags","RF_UNIQUE");
  if (((!(bool)new.x._3_1_) || (friends_race->cur_num < (int)(uint)friends_race->max_num)) &&
     ((L'\0' < new.y || ((bool)new.x._3_1_)))) {
    extra_chance = total;
    if ((new.y < L'\n') && (!(bool)new.x._3_1_)) {
      iVar2 = total * new.y;
      extra_chance = (total * new.y) / 10;
      uVar3 = Rand_div(10);
      if (iVar2 % 10 < (int)uVar3) {
        extra_chance = extra_chance + L'\x01';
      }
    }
    if (L'\0' < extra_chance) {
      if (race->ridx == friends_race->ridx) {
        _Var1 = place_new_monster_group(c,grid,race,sleep,group_info,extra_chance,origin);
        return _Var1;
      }
      wVar4 = scatter_ext((chunk_conflict *)c,(loc *)&stack0xffffffffffffffb4,L'\x01',(loc)grid,
                          (uint)z_info->monster_group_dist,false,square_isopen);
      if (L'\0' < wVar4) {
        local_4d = place_new_monster_one(c,lStack_4c,friends_race,sleep,group_info,origin);
        if (L'\x01' < extra_chance) {
          local_4d = place_new_monster_group
                               (c,lStack_4c,friends_race,sleep,group_info,extra_chance,origin);
        }
        return local_4d;
      }
    }
  }
  return false;
}

Assistant:

static bool place_friends(struct chunk *c, struct loc grid, struct monster_race *race,
		struct monster_race *friends_race, int total, bool sleep,
		struct monster_group_info group_info, uint8_t origin)
{
	int extra_chance;

	/* Find the difference between current dungeon depth and monster level */
	int level_difference = c->depth - friends_race->level + 5;

	/* Handle unique monsters */
	bool is_unique = rf_has(friends_race->flags, RF_UNIQUE);

	/* Make sure the unique hasn't been killed already */
	if (is_unique && (friends_race->cur_num >= friends_race->max_num)) {
		return false;
	}

	/* More than 4 levels OoD, no groups allowed */
	if (level_difference <= 0 && !is_unique) {
		return false;
	}

	/* Reduce group size within 5 levels of natural depth*/
	if (level_difference < 10 && !is_unique) {
		extra_chance = (total * level_difference) % 10;
		total = total * level_difference / 10;

		/* Instead of flooring the group value, we use the decimal place
		   as a chance of an extra monster */
		if (randint0(10) > extra_chance) {
			total += 1;
		}
	}

	/* No monsters in this group */
	if (total > 0) {
		/* Handle friends same as original monster */
		if (race->ridx == friends_race->ridx) {
			return place_new_monster_group(c, grid, race, sleep, group_info,
										   total, origin);
		} else {
			struct loc new;

			/* Find a nearby place to put the other groups. */
			if (scatter_ext(c, &new, 1, grid,
					z_info->monster_group_dist, false,
					square_isopen) > 0) {
				/* Place the monsters */
				bool success = place_new_monster_one(c, new,
					friends_race, sleep, group_info, origin);

				if (total > 1) {
					success = place_new_monster_group(c,
						new, friends_race, sleep,
						group_info, total, origin);
				}
				return success;
			}
		}
	}

	return false;
}